

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

aiNode * anon_unknown.dwarf_8fc1fa::ProcessSpatialStructure
                   (aiNode *parent,IfcProduct *el,ConversionData *conv,
                   vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                   *collect_openings)

{
  uint uVar1;
  DB *pDVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar5;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  aiNode *paVar22;
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *pmVar23;
  bool bVar24;
  bool bVar25;
  IfcSpace *pIVar26;
  IfcAnnotation *pIVar27;
  aiNode *paVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  size_type sVar30;
  aiMetadata *this;
  reference key;
  aiMatrix4x4 *m;
  IfcObjectPlacement *place;
  Object *pOVar31;
  IfcRelContainedInSpatialStructure *pIVar32;
  IfcSpatialStructureElement *pIVar33;
  undefined1 *this_00;
  IfcOpeningElement *pIVar34;
  IfcRelVoidsElement *pIVar35;
  IfcElement *pIVar36;
  IfcProduct *el_00;
  aiMatrix4x4t<float> *this_01;
  reference this_02;
  reference ppVar37;
  LazyObject *pLVar38;
  IfcObjectDefinition *pIVar39;
  uint64_t uVar40;
  uint64_t uVar41;
  pointer paVar42;
  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
  *this_03;
  Lazy *pLVar43;
  size_type sVar44;
  ulong uVar45;
  aiNode **ppaVar46;
  reference ppaVar47;
  pointer *ppTVar48;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar49;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar50;
  uint64_t local_9c8;
  _Base_ptr local_9c0;
  _Self local_9b8;
  uint64_t local_9b0;
  _Self local_9a8 [4];
  aiNode *local_988;
  aiNode *nd2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *__range3_1;
  aiNode *local_960;
  aiNode *ndnew_2;
  IfcProduct *prod;
  IfcObjectDefinition *def;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_1UL,_0UL> *__range4_1;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr_1;
  IfcRelAggregates *aggr;
  _Self local_918;
  pointer local_910;
  aiMatrix4x4t<double> local_908;
  aiMatrix4x4t<double> local_888;
  reference local_808;
  TempOpening *op;
  iterator __end8;
  iterator __begin8;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  aiMatrix4x4t<double> local_7a8;
  aiNode *local_728;
  aiNode *ndnew_1;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr;
  IfcFeatureElementSubtraction *open;
  IfcRelVoidsElement *fills;
  aiNode *ndnew;
  IfcProduct *pro;
  const_iterator __end4;
  const_iterator __begin4;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL> *__range4;
  IfcRelContainedInSpatialStructure *cont;
  LazyObject *obj;
  _Self local_6b0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_6a8;
  RefMapRange range2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_690;
  RefMapRange range;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  undefined1 local_660 [7];
  bool didinv;
  IfcMatrix4 myInv;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  value_type *kv;
  iterator __end3;
  iterator __begin3;
  Metadata *__range3;
  uint index;
  aiMetadata *data;
  const_iterator it;
  Metadata properties;
  uint64_t local_150;
  undefined1 local_148 [8];
  RefMapRange children;
  uint64_t local_128;
  byte local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  aiNode *local_48;
  aiNode *nd;
  RefMap *pRStack_38;
  bool skipGeometry;
  RefMap *refs;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
  *collect_openings_local;
  ConversionData *conv_local;
  IfcProduct *el_local;
  aiNode *parent_local;
  
  refs = (RefMap *)collect_openings;
  collect_openings_local =
       (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)conv;
  conv_local = (ConversionData *)el;
  el_local = (IfcProduct *)parent;
  pRStack_38 = Assimp::STEP::DB::GetRefs(conv->db);
  nd._7_1_ = 0;
  if ((((ulong)(collect_openings_local[0xd].
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                ._M_impl.super__Vector_impl_data._M_finish)->solid & 1) != 0) &&
     (pIVar26 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcSpace>
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18))),
     pIVar26 != (IfcSpace *)0x0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug
              ("skipping IfcSpace entity due to importer settings");
    nd._7_1_ = 1;
  }
  if ((((ulong)(collect_openings_local[0xd].
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                ._M_impl.super__Vector_impl_data._M_finish)->solid & 0x10000) == 0) ||
     (pIVar27 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcAnnotation>
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18))),
     pIVar27 == (IfcAnnotation *)0x0)) {
    paVar28 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar28);
    local_48 = paVar28;
    Assimp::STEP::Object::GetClassName_abi_cxx11_
              (&local_f8,
               (Object *)
               ((long)&conv_local->len_scale + *(long *)((long)conv_local->len_scale + -0x18)));
    std::operator+(&local_d8,&local_f8,"_");
    bVar24 = Assimp::STEP::Maybe::operator_cast_to_bool((Maybe *)&(conv_local->wcs).a2);
    local_11a = 0;
    if (bVar24) {
      pbVar29 = Assimp::STEP::
                Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&(conv_local->wcs).a2);
      std::__cxx11::string::string((string *)&local_118,(string *)pbVar29);
    }
    else {
      std::allocator<char>::allocator();
      local_11a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Unnamed",&local_119);
    }
    std::operator+(&local_b8,&local_d8,&local_118);
    std::operator+(&local_98,&local_b8,"_");
    std::operator+(&local_78,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &conv_local->plane_angle_in_radians);
    aiString::Set((aiString *)paVar28,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    local_48->mParent = (aiNode *)el_local;
    pvVar6 = collect_openings_local + 0xe;
    local_128 = Assimp::STEP::Object::GetID
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18)));
    pVar49 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &(pvVar6->
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     )._M_impl.super__Vector_impl_data._M_finish,&local_128);
    pmVar23 = pRStack_38;
    children.second._M_node = (_Base_ptr)pVar49.first._M_node;
    local_150 = Assimp::STEP::Object::GetID
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18)));
    _local_148 = std::
                 multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::equal_range(pmVar23,&local_150);
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::end(pRStack_38);
    bVar24 = std::operator!=((_Self *)local_148,
                             (_Self *)&properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar24) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&it);
      bVar24 = std::operator==((_Self *)local_148,&children.first);
      if (bVar24) {
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                  operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>
                             *)local_148);
        ProcessMetadata(ppVar37->second,(ConversionData *)collect_openings_local,(Metadata *)&it);
      }
      else {
        data = (aiMetadata *)local_148;
        while (bVar24 = std::operator!=((_Self *)&data,&children.first), bVar24) {
          ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                    operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>
                               *)&data);
          ProcessMetadata(ppVar37->second,(ConversionData *)collect_openings_local,(Metadata *)&it);
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                    ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                     &data);
        }
      }
      bVar24 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&it);
      if (!bVar24) {
        sVar30 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&it);
        this = aiMetadata::Alloc((uint)sVar30);
        __range3._4_4_ = 0;
        __end3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&it);
        kv = (value_type *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&it);
        while (bVar24 = std::operator!=(&__end3,(_Self *)&kv), bVar24) {
          key = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end3);
          aiString::aiString((aiString *)
                             ((long)&openings.
                                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &key->second);
          aiMetadata::Set<aiString>
                    (this,__range3._4_4_,&key->first,
                     (aiString *)
                     ((long)&openings.
                             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end3);
          __range3._4_4_ = __range3._4_4_ + 1;
        }
        local_48->mMetaData = this;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&it);
    }
    bVar24 = Assimp::STEP::Maybe::operator_cast_to_bool((Maybe *)&conv_local->cached_meshes);
    if (bVar24) {
      m = &local_48->mTransformation;
      pLVar43 = (Lazy *)Assimp::STEP::
                        Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Get
                                  ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                                    *)&conv_local->cached_meshes);
      place = Assimp::STEP::Lazy::operator_cast_to_IfcObjectPlacement_(pLVar43);
      ResolveObjectPlacement(m,place,(ConversionData *)collect_openings_local);
    }
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::vector
              ((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               &myInv.d4);
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_660);
    bVar24 = false;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
    pmVar23 = pRStack_38;
    range2.second._M_node =
         (_Base_ptr)
         Assimp::STEP::Object::GetID
                   ((Object *)
                    ((long)&conv_local->len_scale + *(long *)((long)conv_local->len_scale + -0x18)))
    ;
    pVar50 = std::
             multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::equal_range(pmVar23,(key_type_conflict *)&range2.second);
    pVar5 = pVar50;
    while( true ) {
      range.first = pVar5.second._M_node;
      local_690 = pVar5.first._M_node;
      range2.first = pVar50.second._M_node;
      local_6a8 = pVar50.first._M_node;
      bVar25 = std::operator!=(&local_6a8,&range.first);
      if (!bVar25) break;
      pvVar6 = collect_openings_local + 0xe;
      ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                operator*(&local_6a8);
      local_6b0._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&(pvVar6->
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          )._M_impl.super__Vector_impl_data._M_finish,&ppVar37->second);
      obj = (LazyObject *)
            std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&collect_openings_local[0xe].
                           super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      bVar25 = std::operator!=(&local_6b0,(_Self *)&obj);
      if (!bVar25) {
        pDVar2 = (DB *)collect_openings_local[1].
                       super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                  operator*(&local_6a8);
        pLVar38 = Assimp::STEP::DB::MustGetObject(pDVar2,ppVar37->second);
        pOVar31 = Assimp::STEP::LazyObject::operator->(pLVar38);
        pIVar32 = Assimp::STEP::Object::
                  ToPtr<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure>(pOVar31);
        if (pIVar32 == (IfcRelContainedInSpatialStructure *)0x0) {
          pOVar31 = Assimp::STEP::LazyObject::operator->(pLVar38);
          pIVar35 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRelVoidsElement>
                              (pOVar31);
          if (pIVar35 != (IfcRelVoidsElement *)0x0) {
            pIVar36 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>::operator->
                                ((Lazy<Assimp::IFC::Schema_2x3::IfcElement> *)
                                 &(pIVar35->super_IfcRelConnects).field_0xb8);
            uVar40 = Assimp::STEP::Object::GetID
                               ((Object *)
                                (&(pIVar36->super_IfcProduct).super_IfcObject.field_0x0 +
                                *(long *)(*(long *)&(pIVar36->super_IfcProduct).super_IfcObject +
                                         -0x18)));
            uVar41 = Assimp::STEP::Object::GetID
                               ((Object *)
                                ((long)&conv_local->len_scale +
                                *(long *)((long)conv_local->len_scale + -0x18)));
            if (uVar40 == uVar41) {
              el_00 = (IfcProduct *)
                      Assimp::STEP::Lazy::operator_cast_to_IfcFeatureElementSubtraction_
                                ((Lazy *)&pIVar35->RelatedOpeningElement);
              paVar28 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar28);
              ppTVar48 = &openings_local.
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::unique_ptr<aiNode,std::default_delete<aiNode>>::
              unique_ptr<std::default_delete<aiNode>,void>
                        ((unique_ptr<aiNode,std::default_delete<aiNode>> *)ppTVar48,paVar28);
              paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                  ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)ppTVar48);
              aiString::Set(&paVar42->mName,"$RelVoidsElement");
              paVar28 = local_48;
              ppTVar48 = &openings_local.
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                  ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)ppTVar48);
              paVar22 = local_48;
              paVar42->mParent = paVar28;
              paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                  ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)ppTVar48);
              fVar18 = (paVar22->mTransformation).a1;
              fVar19 = (paVar22->mTransformation).a2;
              fVar20 = (paVar22->mTransformation).a3;
              fVar21 = (paVar22->mTransformation).a4;
              fVar14 = (paVar22->mTransformation).b1;
              fVar15 = (paVar22->mTransformation).b2;
              fVar16 = (paVar22->mTransformation).b3;
              fVar17 = (paVar22->mTransformation).b4;
              fVar10 = (paVar22->mTransformation).c1;
              fVar11 = (paVar22->mTransformation).c2;
              fVar12 = (paVar22->mTransformation).c3;
              fVar13 = (paVar22->mTransformation).c4;
              fVar7 = (paVar22->mTransformation).d2;
              fVar8 = (paVar22->mTransformation).d3;
              fVar9 = (paVar22->mTransformation).d4;
              (paVar42->mTransformation).d1 = (paVar22->mTransformation).d1;
              (paVar42->mTransformation).d2 = fVar7;
              (paVar42->mTransformation).d3 = fVar8;
              (paVar42->mTransformation).d4 = fVar9;
              (paVar42->mTransformation).c1 = fVar10;
              (paVar42->mTransformation).c2 = fVar11;
              (paVar42->mTransformation).c3 = fVar12;
              (paVar42->mTransformation).c4 = fVar13;
              (paVar42->mTransformation).b1 = fVar14;
              (paVar42->mTransformation).b2 = fVar15;
              (paVar42->mTransformation).b3 = fVar16;
              (paVar42->mTransformation).b4 = fVar17;
              (paVar42->mTransformation).a1 = fVar18;
              (paVar42->mTransformation).a2 = fVar19;
              (paVar42->mTransformation).a3 = fVar20;
              (paVar42->mTransformation).a4 = fVar21;
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                     &ndnew_1);
              paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::get
                                  ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)ppTVar48);
              local_728 = ProcessSpatialStructure
                                    (paVar42,el_00,(ConversionData *)collect_openings_local,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)&ndnew_1);
              if (local_728 != (aiNode *)0x0) {
                paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                    ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                     &openings_local.
                                      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                paVar42->mNumChildren = 1;
                ppaVar46 = (aiNode **)operator_new__(8);
                memset(ppaVar46,0,8);
                paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                    ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                     &openings_local.
                                      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                paVar28 = local_728;
                paVar42->mChildren = ppaVar46;
                paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                    ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                     &openings_local.
                                      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                *paVar42->mChildren = paVar28;
                sVar44 = std::
                         vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                         ::size((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 *)&ndnew_1);
                if (sVar44 != 0) {
                  if (!bVar24) {
                    __range8 = *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 **)&local_48->mTransformation;
                    uStack_7e0._0_4_ = (local_48->mTransformation).a3;
                    uStack_7e0._4_4_ = (local_48->mTransformation).a4;
                    local_7d8._0_4_ = (local_48->mTransformation).b1;
                    local_7d8._4_4_ = (local_48->mTransformation).b2;
                    uStack_7d0._0_4_ = (local_48->mTransformation).b3;
                    uStack_7d0._4_4_ = (local_48->mTransformation).b4;
                    local_7c8._0_4_ = (local_48->mTransformation).c1;
                    local_7c8._4_4_ = (local_48->mTransformation).c2;
                    uStack_7c0._0_4_ = (local_48->mTransformation).c3;
                    uStack_7c0._4_4_ = (local_48->mTransformation).c4;
                    local_7b8._0_4_ = (local_48->mTransformation).d1;
                    local_7b8._4_4_ = (local_48->mTransformation).d2;
                    uStack_7b0._0_4_ = (local_48->mTransformation).d3;
                    uStack_7b0._4_4_ = (local_48->mTransformation).d4;
                    this_01 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&__range8);
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(&local_7a8,(aiMatrix4x4t *)this_01);
                    memcpy(local_660,&local_7a8,0x80);
                    bVar24 = true;
                  }
                  __end8 = std::
                           vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           ::begin((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                    *)&ndnew_1);
                  op = (TempOpening *)
                       std::
                       vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
                       end((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                            *)&ndnew_1);
                  while (bVar25 = __gnu_cxx::operator!=
                                            (&__end8,(
                                                  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                                                  *)&op), bVar25) {
                    this_02 = __gnu_cxx::
                              __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                              ::operator*(&__end8);
                    local_808 = this_02;
                    paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                        ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                         &openings_local.
                                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                              (&local_908,(aiMatrix4x4t *)&(*paVar42->mChildren)->mTransformation);
                    aiMatrix4x4t<double>::operator*
                              (&local_888,(aiMatrix4x4t<double> *)local_660,&local_908);
                    Assimp::IFC::TempOpening::Transform(this_02,&local_888);
                    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                    ::push_back((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 *)&myInv.d4,local_808);
                    __gnu_cxx::
                    __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                    ::operator++(&__end8);
                  }
                }
                local_910 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release
                                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                       &openings_local.
                                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second,&local_910);
              }
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )&ndnew_1);
              std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                        ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                         &openings_local.
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
        }
        else {
          pIVar33 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::
                    operator->(&pIVar32->RelatingStructure);
          uVar40 = Assimp::STEP::Object::GetID
                             ((Object *)
                              (&(pIVar33->super_IfcProduct).super_IfcObject.field_0x0 +
                              *(long *)(*(long *)&(pIVar33->super_IfcProduct).super_IfcObject +
                                       -0x18)));
          uVar41 = Assimp::STEP::Object::GetID
                             ((Object *)
                              ((long)&conv_local->len_scale +
                              *(long *)((long)conv_local->len_scale + -0x18)));
          if (uVar40 == uVar41) {
            this_00 = &(pIVar32->super_IfcRelConnects).field_0xb8;
            __end4 = std::
                     vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
                     ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
                              *)this_00);
            pro = (IfcProduct *)
                  std::
                  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
                  ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
                         *)this_00);
            while (bVar25 = __gnu_cxx::operator!=
                                      (&__end4,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>_>
                                                *)&pro), bVar25) {
              pLVar43 = (Lazy *)__gnu_cxx::
                                __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>_>
                                ::operator*(&__end4);
              ndnew = (aiNode *)Assimp::STEP::Lazy::operator_cast_to_IfcProduct_(pLVar43);
              pIVar34 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcOpeningElement>
                                  ((Object *)
                                   ((ndnew->mName).data +
                                   *(long *)(*(long *)&ndnew->mName + -0x18) + -4));
              if ((pIVar34 == (IfcOpeningElement *)0x0) &&
                 (fills = (IfcRelVoidsElement *)
                          ProcessSpatialStructure
                                    (local_48,(IfcProduct *)ndnew,
                                     (ConversionData *)collect_openings_local,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)0x0), (aiNode *)fills != (aiNode *)0x0)) {
                std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second,
                           (value_type *)&fills);
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>_>
              ::operator++(&__end4);
            }
          }
        }
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                (&local_6a8);
      pVar5.second._M_node = range.first._M_node;
      pVar5.first._M_node = local_690._M_node;
      pVar50.second._M_node = range2.first._M_node;
      pVar50.first._M_node = local_6a8._M_node;
    }
    while (bVar24 = std::operator!=(&local_690,&range.first), bVar24) {
      pvVar6 = collect_openings_local + 0xe;
      ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                operator*(&local_690);
      local_918._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&(pvVar6->
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          )._M_impl.super__Vector_impl_data._M_finish,&ppVar37->second);
      aggr = (IfcRelAggregates *)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&collect_openings_local[0xe].
                            super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      bVar24 = std::operator!=(&local_918,(_Self *)&aggr);
      if (!bVar24) {
        pDVar2 = (DB *)collect_openings_local[1].
                       super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                  operator*(&local_690);
        pLVar38 = Assimp::STEP::DB::GetObject(pDVar2,ppVar37->second);
        nd_aggr_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
        super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
        super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
             (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
             Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelAggregates>(pLVar38);
        if ((tuple<aiNode_*,_std::default_delete<aiNode>_>)
            nd_aggr_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl !=
            (_Head_base<0UL,_aiNode_*,_false>)0x0) {
          pIVar39 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>::operator->
                              ((Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition> *)
                               ((long)nd_aggr_1._M_t.
                                      super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                      .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0xa8));
          uVar40 = Assimp::STEP::Object::GetID
                             ((Object *)
                              ((long)&(pIVar39->super_IfcRoot).
                                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                      _vptr_ObjectHelper +
                              (long)(pIVar39->super_IfcRoot).
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                    _vptr_ObjectHelper[-3]));
          uVar41 = Assimp::STEP::Object::GetID
                             ((Object *)
                              ((long)&conv_local->len_scale +
                              *(long *)((long)conv_local->len_scale + -0x18)));
          if (uVar40 == uVar41) {
            paVar28 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar28);
            std::unique_ptr<aiNode,std::default_delete<aiNode>>::
            unique_ptr<std::default_delete<aiNode>,void>
                      ((unique_ptr<aiNode,std::default_delete<aiNode>> *)&__range4_1,paVar28);
            paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1);
            aiString::Set(&paVar42->mName,"$RelAggregates");
            paVar28 = local_48;
            paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1);
            paVar22 = local_48;
            paVar42->mParent = paVar28;
            paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1);
            fVar18 = (paVar22->mTransformation).a1;
            fVar19 = (paVar22->mTransformation).a2;
            fVar20 = (paVar22->mTransformation).a3;
            fVar21 = (paVar22->mTransformation).a4;
            fVar14 = (paVar22->mTransformation).b1;
            fVar15 = (paVar22->mTransformation).b2;
            fVar16 = (paVar22->mTransformation).b3;
            fVar17 = (paVar22->mTransformation).b4;
            fVar10 = (paVar22->mTransformation).c1;
            fVar11 = (paVar22->mTransformation).c2;
            fVar12 = (paVar22->mTransformation).c3;
            fVar13 = (paVar22->mTransformation).c4;
            fVar7 = (paVar22->mTransformation).d2;
            fVar8 = (paVar22->mTransformation).d3;
            fVar9 = (paVar22->mTransformation).d4;
            (paVar42->mTransformation).d1 = (paVar22->mTransformation).d1;
            (paVar42->mTransformation).d2 = fVar7;
            (paVar42->mTransformation).d3 = fVar8;
            (paVar42->mTransformation).d4 = fVar9;
            (paVar42->mTransformation).c1 = fVar10;
            (paVar42->mTransformation).c2 = fVar11;
            (paVar42->mTransformation).c3 = fVar12;
            (paVar42->mTransformation).c4 = fVar13;
            (paVar42->mTransformation).b1 = fVar14;
            (paVar42->mTransformation).b2 = fVar15;
            (paVar42->mTransformation).b3 = fVar16;
            (paVar42->mTransformation).b4 = fVar17;
            (paVar42->mTransformation).a1 = fVar18;
            (paVar42->mTransformation).a2 = fVar19;
            (paVar42->mTransformation).a3 = fVar20;
            (paVar42->mTransformation).a4 = fVar21;
            sVar44 = std::
                     vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                     ::size((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                             *)((long)nd_aggr_1._M_t.
                                      super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                      .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0xb0));
            auVar3._8_8_ = 0;
            auVar3._0_8_ = sVar44;
            uVar45 = SUB168(auVar3 * ZEXT816(8),0);
            if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
              uVar45 = 0xffffffffffffffff;
            }
            ppaVar46 = (aiNode **)operator_new__(uVar45);
            memset(ppaVar46,0,uVar45);
            paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1);
            paVar42->mChildren = ppaVar46;
            this_03 = (vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                       *)((long)nd_aggr_1._M_t.
                                super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                                super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0xb0);
            __end4_1 = std::
                       vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                       ::begin(this_03);
            def = (IfcObjectDefinition *)
                  std::
                  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                  ::end(this_03);
            while (bVar24 = __gnu_cxx::operator!=
                                      (&__end4_1,
                                       (__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
                                        *)&def), bVar24) {
              pLVar43 = (Lazy *)__gnu_cxx::
                                __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
                                ::operator*(&__end4_1);
              prod = (IfcProduct *)
                     Assimp::STEP::Lazy::operator_cast_to_IfcObjectDefinition_(pLVar43);
              ndnew_2 = (aiNode *)
                        Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcProduct>
                                  ((Object *)
                                   ((long)&((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL> *)
                                           &(prod->super_IfcObject).field_0x0)->_vptr_ObjectHelper +
                                   *(long *)(*(long *)&prod->super_IfcObject + -0x18)));
              if (ndnew_2 != (aiNode *)0x0) {
                paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::get
                                    ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1
                                    );
                paVar28 = ProcessSpatialStructure
                                    (paVar42,(IfcProduct *)ndnew_2,
                                     (ConversionData *)collect_openings_local,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)0x0);
                local_960 = paVar28;
                if (paVar28 != (aiNode *)0x0) {
                  paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                       &__range4_1);
                  ppaVar46 = paVar42->mChildren;
                  paVar42 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->
                                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)
                                       &__range4_1);
                  uVar1 = paVar42->mNumChildren;
                  paVar42->mNumChildren = uVar1 + 1;
                  ppaVar46[uVar1] = paVar28;
                }
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
              ::operator++(&__end4_1);
            }
            __range3_1 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                         std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release
                                   ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1)
            ;
            std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                      ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second,
                       (value_type *)&__range3_1);
            std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&__range4_1);
          }
        }
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                (&local_690);
    }
    collect_openings_local[0xe].
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)refs;
    if (collect_openings_local[0xe].
        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      collect_openings_local[0xd].
      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&myInv.d4;
    }
    if ((nd._7_1_ & 1) == 0) {
      ProcessProductRepresentation
                ((IfcProduct *)conv_local,local_48,
                 (vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second,
                 (ConversionData *)collect_openings_local);
      collect_openings_local[0xe].
      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      collect_openings_local[0xd].
      super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    sVar44 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                       ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
    if (sVar44 != 0) {
      sVar44 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                         ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar44;
      uVar45 = SUB168(auVar4 * ZEXT816(8),0);
      if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
        uVar45 = 0xffffffffffffffff;
      }
      ppaVar46 = (aiNode **)operator_new__(uVar45);
      memset(ppaVar46,0,uVar45);
      local_48->mChildren = ppaVar46;
      __end3_1 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
      nd2 = (aiNode *)
            std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                      ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
      while (bVar24 = __gnu_cxx::operator!=
                                (&__end3_1,
                                 (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                                  *)&nd2), bVar24) {
        ppaVar47 = __gnu_cxx::
                   __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
                   operator*(&__end3_1);
        local_988 = *ppaVar47;
        uVar1 = local_48->mNumChildren;
        local_48->mNumChildren = uVar1 + 1;
        local_48->mChildren[uVar1] = local_988;
        local_988->mParent = local_48;
        __gnu_cxx::__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
        operator++(&__end3_1);
      }
    }
    pvVar6 = collect_openings_local + 0xe;
    local_9b0 = Assimp::STEP::Object::GetID
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18)));
    local_9a8[0]._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &(pvVar6->
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     )._M_impl.super__Vector_impl_data._M_finish,&local_9b0);
    local_9b8._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &collect_openings_local[0xe].
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    bVar24 = std::operator!=(local_9a8,&local_9b8);
    if (!bVar24) {
      __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x365,
                    "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
                   );
    }
    ppTVar48 = &collect_openings_local[0xe].
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_9c8 = Assimp::STEP::Object::GetID
                          ((Object *)
                           ((long)&conv_local->len_scale +
                           *(long *)((long)conv_local->len_scale + -0x18)));
    local_9c0 = (_Base_ptr)
                std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                find((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )ppTVar48,&local_9c8);
    std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::erase_abi_cxx11_
              ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)ppTVar48
               ,(const_iterator)local_9c0);
    parent_local = local_48;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&range.second);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              ((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               &myInv.d4);
  }
  else {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug
              ("skipping IfcAnnotation entity due to importer settings");
    parent_local = (aiNode *)0x0;
  }
  return parent_local;
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}